

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

bool __thiscall llama_context::rm_adapter_lora(llama_context *this,llama_adapter_lora *adapter)

{
  iterator __it;
  llama_adapter_lora *local_18;
  
  local_18 = adapter;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: adapter = %p\n","rm_adapter_lora",adapter);
  __it = std::
         _Hashtable<llama_adapter_lora_*,_std::pair<llama_adapter_lora_*const,_float>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<llama_adapter_lora_*>,_std::hash<llama_adapter_lora_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->loras)._M_h,&local_18);
  if (__it.super__Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false>._M_cur !=
      (__node_type *)0x0) {
    std::
    _Hashtable<llama_adapter_lora_*,_std::pair<llama_adapter_lora_*const,_float>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<llama_adapter_lora_*>,_std::hash<llama_adapter_lora_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->loras)._M_h,
            (const_iterator)
            __it.super__Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false>.
            _M_cur);
  }
  return __it.super__Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false>._M_cur
         != (__node_type *)0x0;
}

Assistant:

bool llama_context::rm_adapter_lora(
            llama_adapter_lora * adapter) {
    LLAMA_LOG_DEBUG("%s: adapter = %p\n", __func__, (void *) adapter);

    auto pos = loras.find(adapter);
    if (pos != loras.end()) {
        loras.erase(pos);
        return true;
    }

    return false;
}